

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O0

_Bool design_jewellery(object *obj,wchar_t lev)

{
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t lev_local;
  object *obj_local;
  
  allocate_potential(obj,lev);
  _Var1 = choose_type(obj);
  if (_Var1) {
    haggle_till_done((artifact *)0x0,obj);
    uVar2 = Rand_div(100);
    if ((int)uVar2 < 5) {
      make_terrible((artifact *)0x0,obj);
    }
    final_check((artifact *)0x0,obj);
    obj_local._7_1_ = true;
  }
  else {
    obj_local._7_1_ = false;
  }
  return obj_local._7_1_;
}

Assistant:

bool design_jewellery(struct object *obj, int lev)
{

	/* Assign it a potential. */
	allocate_potential(obj, lev);

	/* Assign a type. */
	if (!choose_type(obj))
		return false;

	/* Add extra qualities until done. */
	haggle_till_done(NULL, obj);

	/* Decide if the object is to be terrible. */
	if (TERRIBLE_CHANCE > randint0(100)) {

		/* If it is, add a few benefits and more drawbacks. */
		make_terrible(NULL, obj);
	}

	/* Remove contradictory powers. */
	final_check(NULL, obj);

	return true;
}